

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ExecutionModel EVar3;
  long lVar4;
  bool bVar5;
  undefined8 *puVar6;
  SPIRVariable *var;
  SPIRType *pSVar7;
  long *plVar8;
  SPIREntryPoint *pSVar9;
  runtime_error *this_00;
  ulong uVar10;
  char *pcVar11;
  size_type *psVar12;
  undefined8 uVar13;
  string entry_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string return_type;
  char (*in_stack_ffffffffffffff58) [12];
  char (*pacVar14) [12];
  char (*pacVar15) [12];
  char (*local_a0) [12];
  char *local_98;
  long lStack_90;
  string local_88;
  ulong *local_68;
  size_type local_60;
  ulong local_58;
  undefined8 uStack_50;
  char **local_48;
  long local_40;
  char *local_38 [2];
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&stack0xffffffffffffff58,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_88,this,type,0);
  pcVar11 = (char *)0xf;
  if (in_stack_ffffffffffffff58 != (char (*) [12])&local_98) {
    pcVar11 = local_98;
  }
  if (pcVar11 < *local_a0 + (long)(char *)local_88._M_string_length) {
    uVar13 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar13 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < *local_a0 + (long)(char *)local_88._M_string_length) goto LAB_0024af99;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_88,0,(char *)0x0,(ulong)in_stack_ffffffffffffff58);
  }
  else {
LAB_0024af99:
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::_M_append
                       (&stack0xffffffffffffff58,(ulong)local_88._M_dataplus._M_p);
  }
  local_68 = &local_58;
  puVar1 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar1) {
    local_58 = *puVar1;
    uStack_50 = puVar6[3];
  }
  else {
    local_58 = *puVar1;
    local_68 = (ulong *)*puVar6;
  }
  local_60 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  paVar2 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (in_stack_ffffffffffffff58 != (char (*) [12])&local_98) {
    operator_delete(in_stack_ffffffffffffff58);
  }
  if ((this->super_CompilerGLSL).processing_entry_point == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_68 == &local_58) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
    }
    __return_storage_ptr__->_M_string_length = local_60;
    local_60 = 0;
    local_58 = local_58 & 0xffffffffffffff00;
    local_68 = &local_58;
    goto LAB_0024b3fd;
  }
  bVar5 = get_is_rasterization_disabled(this);
  uVar10 = (ulong)(this->stage_out_var_id).id;
  if (!bVar5 && uVar10 != 0) {
    var = Variant::get<spirv_cross::SPIRVariable>
                    ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr + uVar10);
    pSVar7 = Compiler::get_variable_data_type((Compiler *)this,var);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_88,this,pSVar7,0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_48,this,type,0);
    uVar13 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      uVar13 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < (char *)local_88._M_string_length + local_40) {
      pcVar11 = (char *)0xf;
      if (local_48 != local_38) {
        pcVar11 = local_38[0];
      }
      if (pcVar11 < (char *)local_88._M_string_length + local_40) goto LAB_0024b0d3;
      plVar8 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_48,0,(char *)0x0,(ulong)local_88._M_dataplus._M_p);
      local_a0 = (char (*) [12])local_88._M_string_length;
    }
    else {
LAB_0024b0d3:
      plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48);
      local_a0 = (char (*) [12])local_88._M_string_length;
    }
    pacVar15 = (char (*) [12])(plVar8 + 2);
    if ((char (*) [12])*plVar8 == pacVar15) {
      local_98 = *(char **)*pacVar15;
      lStack_90 = plVar8[3];
      pacVar14 = (char (*) [12])&local_98;
    }
    else {
      local_98 = *(char **)*pacVar15;
      pacVar14 = (char (*) [12])*plVar8;
    }
    *plVar8 = (long)pacVar15;
    plVar8[1] = 0;
    (*pacVar15)[0] = '\0';
    ::std::__cxx11::string::operator=((string *)&local_68,(string *)&stack0xffffffffffffff58);
    if (pacVar14 != (char (*) [12])&local_98) {
      operator_delete(pacVar14);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  local_98 = (char *)((ulong)local_98 & 0xffffffffffffff00);
  pacVar15 = (char (*) [12])&local_98;
  pSVar9 = Compiler::get_entry_point((Compiler *)this);
  EVar3 = pSVar9->model;
  switch(EVar3) {
  case ExecutionModelVertex:
    bVar5 = (this->msl_options).vertex_for_tessellation;
    if ((bVar5 == true) && ((this->msl_options).msl_version < 0x27d8)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Tessellation requires Metal 1.2.");
      goto LAB_0024b51a;
    }
    pcVar11 = "vertex";
    if (bVar5 != false) {
      pcVar11 = "kernel";
    }
    break;
  case ExecutionModelTessellationControl:
    if ((this->msl_options).msl_version < 0x27d8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Tessellation requires Metal 1.2.");
LAB_0024b51a:
      *(undefined ***)this_00 = &PTR__runtime_error_0049deb0;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar9->flags).lower & 0x2000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Metal does not support isoline tessellation.");
      goto LAB_0024b51a;
    }
  case ExecutionModelGLCompute:
  case ExecutionModelKernel:
    pcVar11 = "kernel";
    break;
  case ExecutionModelTessellationEvaluation:
    if ((this->msl_options).msl_version < 0x27d8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Tessellation requires Metal 1.2.");
      goto LAB_0024b51a;
    }
    if (((pSVar9->flags).lower & 0x2000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Metal does not support isoline tessellation.");
      goto LAB_0024b51a;
    }
    if ((this->msl_options).platform == iOS) {
      bVar5 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_48 = (char **)0x3af1fc;
      if (bVar5) {
        local_48 = (char **)0x3a111c;
      }
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                (&local_88,(spirv_cross *)"[[ patch(",(char (*) [10])&local_48,
                 (char **)") ]] vertex",local_a0);
    }
    else {
      bVar5 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_48 = (char **)0x3af1fc;
      if (bVar5) {
        local_48 = (char **)0x3a111c;
      }
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                (&local_88,(spirv_cross *)"[[ patch(",(char (*) [10])&local_48,(char **)0x3a2bb2,
                 (char (*) [3])&pSVar9->output_vertices,(uint *)") ]] vertex",pacVar15);
    }
    ::std::__cxx11::string::operator=((string *)&stack0xffffffffffffff58,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    goto LAB_0024b363;
  case ExecutionModelGeometry:
switchD_0024b1f5_caseD_3:
    pcVar11 = "unknown";
    break;
  case ExecutionModelFragment:
    bVar5 = uses_explicit_early_fragment_test(this);
    pcVar11 = "fragment";
    if (bVar5) {
      pcVar11 = "[[ early_fragment_tests ]] fragment";
    }
    break;
  default:
    if (EVar3 == ExecutionModelTaskEXT) {
      pcVar11 = "[[object]]";
    }
    else {
      if (EVar3 != ExecutionModelMeshEXT) goto switchD_0024b1f5_caseD_3;
      pcVar11 = "[[mesh]]";
    }
  }
  ::std::__cxx11::string::_M_replace((ulong)&stack0xffffffffffffff58,0,(char *)0x0,(ulong)pcVar11);
LAB_0024b363:
  local_88._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_88,pacVar15,pacVar15);
  ::std::__cxx11::string::append((char *)&local_88);
  plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar12) {
    lVar4 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (pacVar15 != (char (*) [12])&local_98) {
    operator_delete(pacVar15);
  }
LAB_0024b3fd:
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type, 0);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type, 0);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = uses_explicit_early_fragment_test() ? "[[ early_fragment_tests ]] fragment" : "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	case ExecutionModelMeshEXT:
		entry_type = "[[mesh]]";
		break;
	case ExecutionModelTaskEXT:
		entry_type = "[[object]]";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}